

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

void MIR_finish(MIR_context_t ctx)

{
  size_t sVar1;
  MIR_proto_t __ptr;
  MIR_error_func_t p_Var2;
  MIR_proto_t proto;
  MIR_context_t ctx_local;
  
  interp_finish(ctx);
  remove_all_modules(ctx);
  HTAB_MIR_item_t_destroy(&ctx->module_item_tab);
  VARR_MIR_module_tdestroy(&ctx->modules_to_link);
  VARR_MIR_op_tdestroy(&ctx->temp_ops);
  io_finish(ctx);
  VARR_uint8_tdestroy(&ctx->temp_data);
  VARR_uint8_tdestroy(&ctx->used_label_p);
  VARR_chardestroy(&ctx->temp_string);
  while( true ) {
    sVar1 = VARR_MIR_proto_tlength(ctx->unspec_protos);
    if (sVar1 == 0) break;
    __ptr = VARR_MIR_proto_tpop(ctx->unspec_protos);
    VARR_MIR_var_tdestroy(&__ptr->args);
    free(__ptr);
  }
  VARR_MIR_proto_tdestroy(&ctx->unspec_protos);
  string_finish(&ctx->string_ctx->strings,&ctx->string_ctx->string_tab);
  string_finish(&ctx->alias_ctx->aliases,&ctx->alias_ctx->alias_tab);
  simplify_finish(ctx);
  VARR_size_tdestroy(&ctx->insn_nops);
  code_finish(ctx);
  hard_reg_name_finish(ctx);
  if (ctx->curr_func != (MIR_func_t)0x0) {
    p_Var2 = MIR_get_error_func(ctx);
    (*p_Var2)(MIR_finish_error,"finish when function %s is not finished",ctx->curr_func->name);
  }
  if (ctx->curr_module != (MIR_module_t_conflict)0x0) {
    p_Var2 = MIR_get_error_func(ctx);
    (*p_Var2)(MIR_finish_error,"finish when module %s is not finished",ctx->curr_module->name);
  }
  free(ctx->string_ctx);
  free(ctx->alias_ctx);
  free(ctx);
  return;
}

Assistant:

void MIR_finish (MIR_context_t ctx) {
  interp_finish (ctx);
  remove_all_modules (ctx);
  HTAB_DESTROY (MIR_item_t, module_item_tab);
  VARR_DESTROY (MIR_module_t, modules_to_link);
  VARR_DESTROY (MIR_op_t, temp_ops);
#if !MIR_NO_SCAN
  scan_finish (ctx);
#endif
#if !MIR_NO_IO
  io_finish (ctx);
#endif
  VARR_DESTROY (uint8_t, temp_data);
  VARR_DESTROY (uint8_t, used_label_p);
  VARR_DESTROY (char, temp_string);
  while (VARR_LENGTH (MIR_proto_t, unspec_protos) != 0) {
    MIR_proto_t proto = VARR_POP (MIR_proto_t, unspec_protos);
    VARR_DESTROY (MIR_var_t, proto->args);
    free (proto);
  }
  VARR_DESTROY (MIR_proto_t, unspec_protos);
  string_finish (&strings, &string_tab);
  string_finish (&aliases, &alias_tab);
  simplify_finish (ctx);
  VARR_DESTROY (size_t, insn_nops);
  code_finish (ctx);
  hard_reg_name_finish (ctx);
  if (curr_func != NULL)
    MIR_get_error_func (ctx) (MIR_finish_error, "finish when function %s is not finished",
                              curr_func->name);
  if (curr_module != NULL)
    MIR_get_error_func (ctx) (MIR_finish_error, "finish when module %s is not finished",
                              curr_module->name);
  free (ctx->string_ctx);
  free (ctx->alias_ctx);
  free (ctx);
  ctx = NULL;
}